

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringBuilder.cpp
# Opt level: O2

void __thiscall
Js::JSONStringBuilder::AppendArrayString(JSONStringBuilder *this,JSONArray *valueArray)

{
  uint uVar1;
  uint32 count;
  char16 *pcVar2;
  ulong uVar3;
  JSONProperty *prop;
  
  uVar1 = valueArray->length;
  if ((ulong)uVar1 != 0) {
    count = this->indentLevel;
    this->indentLevel = count + 1;
    AppendCharacter(this,L'[');
    if (this->gap != (char16 *)0x0) {
      AppendCharacter(this,L'\n');
      AppendGap(this,this->indentLevel);
    }
    AppendJSONPropertyString(this,(JSONProperty *)(valueArray + 1));
    prop = (JSONProperty *)(valueArray + 4);
    for (uVar3 = 1; pcVar2 = this->gap, uVar3 < uVar1; uVar3 = uVar3 + 1) {
      AppendCharacter(this,L',');
      if (pcVar2 != (char16 *)0x0) {
        AppendCharacter(this,L'\n');
        AppendGap(this,this->indentLevel);
      }
      AppendJSONPropertyString(this,prop);
      prop = prop + 1;
    }
    if (pcVar2 != (char16 *)0x0) {
      AppendCharacter(this,L'\n');
      AppendGap(this,count);
    }
    AppendCharacter(this,L']');
    this->indentLevel = count;
    return;
  }
  AppendCharacter(this,L'[');
  AppendCharacter(this,L']');
  return;
}

Assistant:

void
JSONStringBuilder::AppendArrayString(_In_ JSONArray* valueArray)
{
    uint32 length = valueArray->length;
    if (length == 0)
    {
        this->AppendCharacter(_u('['));
        this->AppendCharacter(_u(']'));
        return;
    }

    const uint32 stepbackLevel = this->indentLevel;
    ++this->indentLevel;

    JSONProperty* arr = valueArray->arr;

    this->AppendCharacter(_u('['));

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(indentLevel);
    }

    this->AppendJSONPropertyString(&arr[0]);

    for (uint32 i = 1; i < length; ++i)
    {
        if (this->gap == nullptr)
        {
            this->AppendCharacter(_u(','));
        }
        else
        {
            this->AppendCharacter(_u(','));
            this->AppendCharacter(_u('\n'));
            this->AppendGap(indentLevel);
        }
        AppendJSONPropertyString(&arr[i]);
    }

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(stepbackLevel);
    }
    this->AppendCharacter(_u(']'));

    this->indentLevel = stepbackLevel;
}